

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void copyDeepTiled(DeepTiledInputPart *in,DeepTiledOutputPart *out)

{
  time_point end;
  time_point end_00;
  time_point end_01;
  time_point start;
  time_point start_00;
  time_point start_01;
  bool bVar1;
  int iVar2;
  TileDescription *pTVar3;
  runtime_error *prVar4;
  int *piVar5;
  reference piVar6;
  char *pcVar7;
  reference this;
  reference ppcVar8;
  reference pvVar9;
  ostream *poVar10;
  double dVar11;
  time_point endWrite;
  time_point startWrite;
  time_point endSampleRead;
  time_point startSampleRead;
  uint64_t p;
  int offset;
  int samplesize_1;
  ConstIterator i_2;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  sampleData;
  int i_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  size_t totalSamples;
  time_point endCountRead;
  time_point startCountRead;
  int samplesize;
  ConstIterator i;
  int bytesPerSample;
  int channelNumber;
  DeepFrameBuffer buffer;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  pixelPtrs;
  uint64_t offsetToOrigin;
  vector<int,_std::allocator<int>_> sampleCount;
  int numChans;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  TileDescription tiling;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 uVar12;
  int in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  int dy2;
  int in_stack_fffffffffffffbe4;
  int dx2;
  int in_stack_fffffffffffffbec;
  undefined4 in_stack_fffffffffffffbf0;
  PixelType in_stack_fffffffffffffbf4;
  Slice *in_stack_fffffffffffffbf8;
  DeepFrameBuffer *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  double in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  size_t in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  DeepSlice *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  size_type local_218;
  int local_210;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_1f0;
  int local_1d4;
  int *local_1d0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  vector<int,_std::allocator<int>_> *local_1c0;
  long local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  DeepSlice *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  DeepFrameBuffer *in_stack_fffffffffffffe90;
  int local_150;
  int local_14c;
  Slice local_148 [3];
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  local_a0;
  long local_88;
  vector<int,_std::allocator<int>_> local_78;
  int local_5c;
  ulong local_58;
  long local_50;
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  undefined8 local_20;
  undefined8 local_18;
  
  Imf_3_3::DeepTiledInputPart::header((DeepTiledInputPart *)0x11a984);
  pTVar3 = Imf_3_3::Header::tileDescription((Header *)0x11a98c);
  local_20._0_4_ = pTVar3->xSize;
  local_20._4_4_ = pTVar3->ySize;
  local_18._0_4_ = pTVar3->mode;
  local_18._4_4_ = pTVar3->roundingMode;
  if ((undefined4)local_18 == 1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"exrmetrics does not support mipmapped deep tiled parts");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((undefined4)local_18 == 2) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"exrmetrics does not support ripmapped deep tiled parts");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Imf_3_3::DeepTiledInputPart::header((DeepTiledInputPart *)0x11aa92);
  Imf_3_3::Header::dataWindow((Header *)0x11aa9a);
  Imath_3_1::Box<Imath_3_1::Vec2<int>_>::Box
            ((Box<Imath_3_1::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (Box<Imath_3_1::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  local_48 = (long)((local_34 - local_3c) + 1);
  local_50 = (long)((local_30 - local_38) + 1);
  local_58 = local_48 * local_50;
  Imf_3_3::DeepTiledInputPart::header((DeepTiledInputPart *)0x11ab0b);
  local_5c = channelCount((Header *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  std::allocator<int>::allocator((allocator<int> *)0x11ab3f);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc00,
             (size_type)in_stack_fffffffffffffbf8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  std::allocator<int>::~allocator((allocator<int> *)0x11ab6b);
  local_88 = local_48 * local_38 + (long)local_3c;
  std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>::allocator
            ((allocator<std::vector<char_*,_std::allocator<char_*>_>_> *)0x11abb7);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::vector((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
            *)in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>::~allocator
            ((allocator<std::vector<char_*,_std::allocator<char_*>_>_> *)0x11abe3);
  Imf_3_3::DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffc00);
  piVar5 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x11abff);
  dx2 = 0;
  dy2 = 0;
  uVar12 = 1;
  Imf_3_3::Slice::Slice
            (local_148,UINT,(char *)(piVar5 + -local_88),4,local_48 << 2,1,1,0.0,false,false);
  Imf_3_3::DeepFrameBuffer::insertSampleCountSlice
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  local_14c = 0;
  local_150 = 0;
  Imf_3_3::DeepTiledOutputPart::header((DeepTiledOutputPart *)0x11ac8d);
  Imf_3_3::Header::channels((Header *)0x11aca4);
  Imf_3_3::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  while( true ) {
    Imf_3_3::DeepTiledOutputPart::header((DeepTiledOutputPart *)0x11ace2);
    Imf_3_3::Header::channels((Header *)0x11acf9);
    Imf_3_3::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
    bVar1 = Imf_3_3::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffbe4,dy2),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
    if (!bVar1) break;
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](&local_a0,(long)local_14c);
    std::vector<char_*,_std::allocator<char_*>_>::resize
              ((vector<char_*,_std::allocator<char_*>_> *)in_stack_fffffffffffffc00,
               (size_type)in_stack_fffffffffffffbf8);
    Imf_3_3::ChannelList::ConstIterator::channel((ConstIterator *)0x11ad8c);
    iVar2 = Imf_3_3::pixelTypeSize(in_stack_fffffffffffffbf4);
    Imf_3_3::ChannelList::ConstIterator::name((ConstIterator *)0x11adc9);
    Imf_3_3::ChannelList::ConstIterator::channel((ConstIterator *)0x11ade0);
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](&local_a0,(long)local_14c);
    std::vector<char_*,_std::allocator<char_*>_>::data
              ((vector<char_*,_std::allocator<char_*>_> *)0x11ae18);
    in_stack_fffffffffffffbf0 = 0;
    dx2 = 0;
    dy2 = 1;
    uVar12 = 1;
    Imf_3_3::DeepSlice::DeepSlice
              (in_stack_fffffffffffffc40,(PixelType)((ulong)in_stack_fffffffffffffc38 >> 0x20),
               in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18,(int)in_stack_fffffffffffffc50,
               (int)in_stack_fffffffffffffc58,in_stack_fffffffffffffc10,
               SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffc08 >> 0x30,0));
    Imf_3_3::DeepFrameBuffer::insert
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    local_14c = local_14c + 1;
    local_150 = iVar2 + local_150;
    Imf_3_3::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbe4,dy2));
  }
  Imf_3_3::DeepTiledInputPart::setFrameBuffer
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),
             (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  Imf_3_3::DeepTiledOutputPart::setFrameBuffer
            ((DeepTiledOutputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),
             (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  local_1a8 = std::chrono::_V2::steady_clock::now();
  Imf_3_3::DeepTiledInputPart::numXTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  Imf_3_3::DeepTiledInputPart::numYTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  uVar12 = 0;
  Imf_3_3::DeepTiledInputPart::readPixelSampleCounts
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbec,dx2,in_stack_fffffffffffffbe4,dy2,in_stack_fffffffffffffbdc,
             (int)in_stack_fffffffffffffc00);
  local_1b0 = std::chrono::_V2::steady_clock::now();
  local_1b8 = 0;
  local_1c0 = &local_78;
  local_1c8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffbe4,dy2),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_fffffffffffffbdc,uVar12));
    if (!bVar1) break;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_1c8);
    local_1d4 = *piVar6;
    local_1b8 = local_1d4 + local_1b8;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_1c8);
  }
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x11b0d7);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffc00,(size_type)in_stack_fffffffffffffbf8,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x11b103);
  local_14c = 0;
  Imf_3_3::DeepTiledInputPart::header((DeepTiledInputPart *)0x11b11b);
  Imf_3_3::Header::channels((Header *)0x11b132);
  Imf_3_3::ChannelList::begin((ChannelList *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
  while( true ) {
    Imf_3_3::DeepTiledInputPart::header((DeepTiledInputPart *)0x11b170);
    Imf_3_3::Header::channels((Header *)0x11b187);
    Imf_3_3::ChannelList::end((ChannelList *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
    bVar1 = Imf_3_3::operator!=((ConstIterator *)CONCAT44(in_stack_fffffffffffffbe4,dy2),
                                (ConstIterator *)CONCAT44(in_stack_fffffffffffffbdc,uVar12));
    if (!bVar1) break;
    Imf_3_3::ChannelList::ConstIterator::channel((ConstIterator *)0x11b1f3);
    iVar2 = Imf_3_3::pixelTypeSize(in_stack_fffffffffffffbf4);
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[](&local_1f0,(long)local_14c);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc00,
               (size_type)in_stack_fffffffffffffbf8);
    local_210 = 0;
    for (local_218 = 0; local_218 < local_58; local_218 = local_218 + 1) {
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::operator[](&local_1f0,(long)local_14c);
      pcVar7 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x11b2a0);
      this = std::
             vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
             ::operator[](&local_a0,(long)local_14c);
      ppcVar8 = std::vector<char_*,_std::allocator<char_*>_>::operator[](this,local_218);
      *ppcVar8 = pcVar7 + local_210 * iVar2;
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_78,local_218);
      local_210 = *pvVar9 + local_210;
    }
    local_14c = local_14c + 1;
    Imf_3_3::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffbe4,dy2));
  }
  std::chrono::_V2::steady_clock::now();
  iVar2 = (int)in_stack_fffffffffffffc00;
  Imf_3_3::DeepTiledInputPart::numXTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  Imf_3_3::DeepTiledInputPart::numYTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  Imf_3_3::DeepTiledInputPart::readTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbec,dx2,in_stack_fffffffffffffbe4,dy2,in_stack_fffffffffffffbdc,
             iVar2);
  std::chrono::_V2::steady_clock::now();
  std::chrono::_V2::steady_clock::now();
  Imf_3_3::DeepTiledInputPart::numXTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  Imf_3_3::DeepTiledInputPart::numYTiles
            ((DeepTiledInputPart *)CONCAT44(in_stack_fffffffffffffbe4,dy2),in_stack_fffffffffffffbdc
            );
  Imf_3_3::DeepTiledOutputPart::writeTiles
            ((DeepTiledOutputPart *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
             in_stack_fffffffffffffbec,dx2,in_stack_fffffffffffffbe4,dy2,in_stack_fffffffffffffbdc,
             iVar2);
  std::chrono::_V2::steady_clock::now();
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"count read time\": ");
  start.__d.__r._4_4_ = in_stack_fffffffffffffbf4;
  start.__d.__r._0_4_ = in_stack_fffffffffffffbf0;
  end.__d.__r._4_4_ = in_stack_fffffffffffffbec;
  end.__d.__r._0_4_ = dx2;
  dVar11 = timing(start,end);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar11);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"sample read time\": ");
  start_00.__d.__r._4_4_ = in_stack_fffffffffffffbf4;
  start_00.__d.__r._0_4_ = in_stack_fffffffffffffbf0;
  end_00.__d.__r._4_4_ = in_stack_fffffffffffffbec;
  end_00.__d.__r._0_4_ = dx2;
  dVar11 = timing(start_00,end_00);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar11);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"write time\": ");
  start_01.__d.__r._4_4_ = in_stack_fffffffffffffbf4;
  start_01.__d.__r._0_4_ = in_stack_fffffffffffffbf0;
  end_01.__d.__r._4_4_ = in_stack_fffffffffffffbec;
  end_01.__d.__r._0_4_ = dx2;
  dVar11 = timing(start_01,end_01);
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar11);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"pixel count\": ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_58);
  std::operator<<(poVar10,",\n");
  poVar10 = std::operator<<((ostream *)&std::cout,"   \"raw size\": ");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_1b8 * local_150 + local_58 * 4);
  std::operator<<(poVar10,",\n");
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  Imf_3_3::DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x11b71b);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::~vector((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  return;
}

Assistant:

void
copyDeepTiled (DeepTiledInputPart& in, DeepTiledOutputPart& out)
{

    TileDescription tiling = in.header ().tileDescription ();

    if (tiling.mode == MIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support mipmapped deep tiled parts");
    }

    if (tiling.mode == RIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support ripmapped deep tiled parts");
    }

    Box2i       dw        = in.header ().dataWindow ();
    uint64_t    width     = dw.max.x + 1 - dw.min.x;
    uint64_t    height    = dw.max.y + 1 - dw.min.y;
    uint64_t    numPixels = width * height;
    int         numChans  = channelCount (in.header ());
    vector<int> sampleCount (numPixels);

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);
    vector<vector<char*>> pixelPtrs (numChans);

    DeepFrameBuffer buffer;

    buffer.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;
    for (ChannelList::ConstIterator i = out.header ().channels ().begin ();
         i != out.header ().channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buffer.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    in.setFrameBuffer (buffer);
    out.setFrameBuffer (buffer);

    steady_clock::time_point startCountRead = steady_clock::now();

    in.readPixelSampleCounts (
        0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
    steady_clock::time_point endCountRead = steady_clock::now();


    size_t totalSamples = 0;

    for (int i: sampleCount)
    {
        totalSamples += i;
    }

    vector<vector<char>> sampleData (numChans);
    channelNumber = 0;
    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += sampleCount[p];
        }

        ++channelNumber;
    }

    steady_clock::time_point startSampleRead = steady_clock::now();
    in.readTiles (0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
    steady_clock::time_point endSampleRead = steady_clock::now();

    steady_clock::time_point startWrite = steady_clock::now();
    out.writeTiles (0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
    steady_clock::time_point endWrite = steady_clock::now();


    cout << "   \"count read time\": " << timing (startCountRead, endCountRead)
         << ",\n";
    cout << "   \"sample read time\": "
         << timing (startSampleRead, endSampleRead) << ",\n";
    cout << "   \"write time\": " << timing (startWrite, endWrite) << ",\n";
    cout << "   \"pixel count\": " << numPixels << ",\n";
    cout << "   \"raw size\": "
         << totalSamples * bytesPerSample + numPixels * sizeof (int) << ",\n";
}